

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

int __thiscall QTreeViewPrivate::indentationForItem(QTreeViewPrivate *this,int item)

{
  int iVar1;
  
  iVar1 = 0;
  if ((-1 < item) && (iVar1 = 0, (ulong)(uint)item < (ulong)(this->viewItems).d.size)) {
    iVar1 = ((uint)this->rootDecoration +
            (uint)*(ushort *)&(this->viewItems).d.ptr[(uint)item].field_0x20) * this->indent;
  }
  return iVar1;
}

Assistant:

int QTreeViewPrivate::indentationForItem(int item) const
{
    if (item < 0 || item >= viewItems.size())
        return 0;
    int level = viewItems.at(item).level;
    if (rootDecoration)
        ++level;
    return level * indent;
}